

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void output_bitmap(gen_ctx_t gen_ctx,char *head,bitmap_t bm,int print_name_p,MIR_reg_t *reg_map)

{
  MIR_context_t ctx;
  FILE *__stream;
  MIR_type_t tp;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((bm != (bitmap_t)0x0) && (bm->els_num != 0)) {
    ctx = gen_ctx->ctx;
    sVar5 = 0;
    do {
      if (bm->varr[sVar5] != 0) {
        fputs(head,(FILE *)gen_ctx->debug_file);
        uVar1 = bm->els_num;
        if (uVar1 != 0) {
          uVar4 = 0;
          uVar8 = 0;
          do {
            while ((bm->varr[uVar4] == 0 || (uVar6 = bm->varr[uVar4] >> (uVar8 & 0x3f), uVar6 == 0))
                  ) {
              uVar4 = uVar4 + 1;
              uVar8 = uVar4 * 0x40;
              if (uVar1 == uVar4) goto LAB_00165478;
            }
            uVar1 = uVar6 & 1;
            while (uVar1 == 0) {
              uVar8 = uVar8 + 1;
              uVar1 = uVar6 & 2;
              uVar6 = uVar6 >> 1;
            }
            fprintf((FILE *)gen_ctx->debug_file," %3lu",uVar8);
            if ((print_name_p != 0) && (reg_map != (MIR_reg_t *)0x0 || 0x21 < uVar8)) {
              if (reg_map == (MIR_reg_t *)0x0) {
                uVar7 = (uint)uVar8;
              }
              else {
                uVar7 = reg_map[uVar8];
              }
              if (uVar7 < 0x21) {
                __assert_fail("reg >= ST1_HARD_REG",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x535,
                              "void output_bitmap(gen_ctx_t, const char *, bitmap_t, int, MIR_reg_t *)"
                             );
              }
              __stream = (FILE *)gen_ctx->debug_file;
              tp = MIR_reg_type(ctx,uVar7 - 0x21,(gen_ctx->curr_func_item->u).func);
              pcVar2 = MIR_type_str(ctx,tp);
              pcVar3 = MIR_reg_name(ctx,uVar7 - 0x21,(gen_ctx->curr_func_item->u).func);
              fprintf(__stream,"(%s:%s)",pcVar2,pcVar3);
            }
            uVar1 = bm->els_num;
            uVar8 = uVar8 + 1;
            uVar4 = uVar8 >> 6;
          } while (uVar4 < uVar1);
        }
LAB_00165478:
        fputc(10,(FILE *)gen_ctx->debug_file);
        return;
      }
      sVar5 = sVar5 + 1;
    } while (bm->els_num != sVar5);
  }
  return;
}

Assistant:

static void output_bitmap (gen_ctx_t gen_ctx, const char *head, bitmap_t bm, int print_name_p,
                           MIR_reg_t *reg_map) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t reg;
  size_t nel;
  bitmap_iterator_t bi;

  if (bm == NULL || bitmap_empty_p (bm)) return;
  fprintf (debug_file, "%s", head);
  FOREACH_BITMAP_BIT (bi, bm, nel) {
    fprintf (debug_file, " %3lu", (unsigned long) nel);
    if (print_name_p && (reg_map != NULL || nel > MAX_HARD_REG)) {
      reg = (MIR_reg_t) nel;
      if (reg_map != NULL) reg = reg_map[nel];
      gen_assert (reg >= MAX_HARD_REG);
      fprintf (debug_file, "(%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func)),
               MIR_reg_name (ctx, reg - MAX_HARD_REG, curr_func_item->u.func));
    }
  }
  fprintf (debug_file, "\n");
}